

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O1

void ScaleUVColsUp2_C(uint8_t *dst_uv,uint8_t *src_uv,int dst_width,int x,int dx)

{
  undefined2 uVar1;
  int iVar2;
  
  if (1 < dst_width) {
    iVar2 = 0;
    do {
      uVar1 = *(undefined2 *)src_uv;
      *(undefined2 *)dst_uv = uVar1;
      *(undefined2 *)(dst_uv + 2) = uVar1;
      src_uv = src_uv + 2;
      dst_uv = dst_uv + 4;
      iVar2 = iVar2 + 2;
    } while (iVar2 < dst_width + -1);
  }
  if ((dst_width & 1U) != 0) {
    *(undefined2 *)dst_uv = *(undefined2 *)src_uv;
  }
  return;
}

Assistant:

void ScaleUVColsUp2_C(uint8_t* dst_uv,
                      const uint8_t* src_uv,
                      int dst_width,
                      int x,
                      int dx) {
  const uint16_t* src = (const uint16_t*)(src_uv);
  uint16_t* dst = (uint16_t*)(dst_uv);
  int j;
  (void)x;
  (void)dx;
  for (j = 0; j < dst_width - 1; j += 2) {
    dst[1] = dst[0] = src[0];
    src += 1;
    dst += 2;
  }
  if (dst_width & 1) {
    dst[0] = src[0];
  }
}